

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

const_iterator __thiscall
VulkanHppGenerator::findSupportedExtension(VulkanHppGenerator *this,string *name)

{
  borrowed_iterator_t<const_std::vector<VulkanHppGenerator::ExtensionData>_&> bVar1;
  string *name_local;
  VulkanHppGenerator *this_local;
  
  bVar1 = std::ranges::__find_if_fn::
          operator()<const_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_VulkanHppGenerator_cpp:2115:46)>
                    ((__find_if_fn *)&std::ranges::find_if,&this->m_extensions,name);
  return (const_iterator)bVar1._M_current;
}

Assistant:

std::vector<VulkanHppGenerator::ExtensionData>::const_iterator VulkanHppGenerator::findSupportedExtension( std::string const & name ) const
{
  return std::ranges::find_if( m_extensions, [&name]( ExtensionData const & ed ) { return ed.name == name; } );
}